

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatTest_JoinArg_Test::TestBody(FormatTest_JoinArg_Test *this)

{
  arg_join<int_*,_char> *in_RCX;
  char *pcVar1;
  arg_join<int_*,_char> *paVar2;
  arg_join<void_**,_char> *args;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_00;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1_00;
  char *pcVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d8;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  AssertionResult gtest_ar;
  int v1 [3];
  undefined1 local_6c [4];
  AssertionResult gtest_ar_7;
  void *v3 [2];
  vector<float,_std::allocator<float>_> v2;
  
  args_1 = &local_d8;
  args_1_00 = &local_d8;
  args_00 = &local_d8;
  v1[0] = 1;
  v1[1] = 2;
  v1[2] = 3;
  v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_d8._M_dataplus._M_p._0_4_ = 0x3f99999a;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&v2,(float *)&local_d8);
  local_d8._M_dataplus._M_p._0_4_ = 0x4059999a;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&v2,(float *)&local_d8);
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = local_6c;
  v3[0] = (AssertHelperData *)v1;
  v3[1] = v1 + 1;
  fmt::v5::format<char[5],fmt::v5::arg_join<int*,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({})",(char (*) [5])local_b8,in_RCX);
  pcVar1 = "(1, 2, 3)";
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(1, 2, 3)\"","format(\"({})\", join(v1, v1 + 3, \", \"))",
             (char (*) [10])"(1, 2, 3)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x715;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x715,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = v1 + 1;
  fmt::v5::format<char[5],fmt::v5::arg_join<int*,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({})",(char (*) [5])local_b8,(arg_join<int_*,_char> *)pcVar1);
  paVar2 = (arg_join<int_*,_char> *)0x1f14a6;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(1)\"","format(\"({})\", join(v1, v1 + 1, \", \"))",
             (char (*) [4])0x1f14a6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    paVar2 = (arg_join<int_*,_char> *)0x716;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x716,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = (AssertHelperData *)v1;
  fmt::v5::format<char[5],fmt::v5::arg_join<int*,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({})",(char (*) [5])local_b8,paVar2);
  paVar2 = (arg_join<int_*,_char> *)0x1e4dc5;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"()\"","format(\"({})\", join(v1, v1, \", \"))",
             (char (*) [3])0x1e4dc5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    paVar2 = (arg_join<int_*,_char> *)0x717;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x717,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = local_6c;
  fmt::v5::format<char[8],fmt::v5::arg_join<int*,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({:03})",(char (*) [8])local_b8,paVar2);
  pcVar1 = "(001, 002, 003)";
  testing::internal::CmpHelperEQ<char[16],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(001, 002, 003)\"",
             "format(\"({:03})\", join(v1, v1 + 3, \", \"))",(char (*) [16])"(001, 002, 003)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x718;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x718,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_b8._0_8_ =
       v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_b8._8_8_ =
       v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  fmt::v5::
  format<char[12],fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({:+06.2f})",(char (*) [12])local_b8,
             (arg_join<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,_char>
              *)pcVar1);
  pcVar1 = "(+01.20, +03.40)";
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(+01.20, +03.40)\"",
             "format(\"({:+06.2f})\", join(v2.begin(), v2.end(), \", \"))",
             (char (*) [17])"(+01.20, +03.40)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x71a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x71a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8._M_allocated_capacity = 0x1f4974;
  local_a8._8_8_ = 2;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = local_6c;
  fmt::v5::format<wchar_t[5],fmt::v5::arg_join<int*,wchar_t>>
            (&local_d8,(v5 *)L"({})",(wchar_t (*) [5])local_b8,(arg_join<int_*,_wchar_t> *)pcVar1);
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            ((internal *)&gtest_ar,"L\"(1, 2, 3)\"","format(L\"({})\", join(v1, v1 + 3, L\", \"))",
             (wchar_t (*) [10])L"(1, 2, 3)",&local_d8);
  std::__cxx11::wstring::~wstring((wstring *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      args_1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               0x1f94d9;
    }
    else {
      args_1 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x71c,(char *)args_1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = local_6c;
  fmt::v5::format<char[8],fmt::v5::arg_join<int*,char>,int>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"{0:{1}}",(char (*) [8])local_b8,(arg_join<int_*,_char> *)&gtest_ar_7,
             (int *)args_1);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1, 2, 3\"","format(\"{0:{1}}\", join(v1, v1 + 3, \", \"), 1)",
             (char (*) [8])"1, 2, 3",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      args_1_00 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  0x1f94d9;
    }
    else {
      args_1_00 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x71d,(char *)args_1_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  args = (arg_join<void_**,_char> *)(v3 + 1);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  fmt::v5::format<char[7],void*,void*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)0x1f0c32,(char (*) [7])v3,(void **)args,(void **)args_1_00);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v2;
  gtest_ar._0_8_ = (char (*) [7])v3;
  fmt::v5::format<char[3],fmt::v5::arg_join<void**,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (v5 *)0x1f0c36,&gtest_ar.success_,args);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_7,"format(\"{}, {}\", v3[0], v3[1])",
             "format(\"{}\", join(v3, v3 + 2, \", \"))",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar_7.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    args_00 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)0x720;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x720,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  local_b8._0_8_ = (AssertHelperData *)v1;
  local_b8._8_8_ = local_6c;
  fmt::v5::format<char[5],fmt::v5::arg_join<int_const*,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({})",(char (*) [5])local_b8,(arg_join<const_int_*,_char> *)args_00);
  pcVar1 = "(1, 2, 3)";
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(1, 2, 3)\"","format(\"({})\", join(v1, \", \"))",
             (char (*) [10])"(1, 2, 3)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar1 = (char *)0x723;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x723,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_b8._0_8_ =
       v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_b8._8_8_ =
       v2.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_a8._M_allocated_capacity = (long)"The invocation upper bound must be >= 0, " + 0x27;
  local_a8._8_8_ = 2;
  fmt::v5::
  format<char[12],fmt::v5::arg_join<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             (v5 *)"({:+06.2f})",(char (*) [12])local_b8,
             (arg_join<__gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>,_char>
              *)pcVar1);
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"(+01.20, +03.40)\"",
             "format(\"({:+06.2f})\", join(v2, \", \"))",(char (*) [17])"(+01.20, +03.40)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x724,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&v2.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(FormatTest, JoinArg) {
  using fmt::join;
  int v1[3] = { 1, 2, 3 };
  std::vector<float> v2;
  v2.push_back(1.2f);
  v2.push_back(3.4f);
  void *v3[2] = { &v1[0], &v1[1] };

  EXPECT_EQ("(1, 2, 3)", format("({})", join(v1, v1 + 3, ", ")));
  EXPECT_EQ("(1)", format("({})", join(v1, v1 + 1, ", ")));
  EXPECT_EQ("()", format("({})", join(v1, v1, ", ")));
  EXPECT_EQ("(001, 002, 003)", format("({:03})", join(v1, v1 + 3, ", ")));
  EXPECT_EQ("(+01.20, +03.40)",
            format("({:+06.2f})", join(v2.begin(), v2.end(), ", ")));

  EXPECT_EQ(L"(1, 2, 3)", format(L"({})", join(v1, v1 + 3, L", ")));
  EXPECT_EQ("1, 2, 3", format("{0:{1}}", join(v1, v1 + 3, ", "), 1));

  EXPECT_EQ(format("{}, {}", v3[0], v3[1]),
            format("{}", join(v3, v3 + 2, ", ")));

#if FMT_USE_TRAILING_RETURN && (!FMT_GCC_VERSION || FMT_GCC_VERSION >= 405)
  EXPECT_EQ("(1, 2, 3)", format("({})", join(v1, ", ")));
  EXPECT_EQ("(+01.20, +03.40)", format("({:+06.2f})", join(v2, ", ")));
#endif
}